

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

DecodePsbtInput * __thiscall
cfd::js::api::json::DecodePsbtInput::GetSighashString_abi_cxx11_
          (DecodePsbtInput *this,DecodePsbtInput *obj)

{
  DecodePsbtInput *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->sighash_);
  return this;
}

Assistant:

static std::string GetSighashString(  // line separate
      const DecodePsbtInput& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.sighash_);
  }